

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namedNodeMap.c
# Opt level: O0

IXML_Node_conflict * ixmlNamedNodeMap_getNamedItem(IXML_NamedNodeMap *nnMap,char *name)

{
  unsigned_long index_00;
  unsigned_long index;
  char *name_local;
  IXML_NamedNodeMap *nnMap_local;
  
  if ((nnMap == (IXML_NamedNodeMap *)0x0) || (name == (char *)0x0)) {
    nnMap_local = (IXML_NamedNodeMap *)0x0;
  }
  else {
    index_00 = ixmlNamedNodeMap_getItemNumber(nnMap,name);
    if (index_00 == 0x6b) {
      nnMap_local = (IXML_NamedNodeMap *)0x0;
    }
    else {
      nnMap_local = (IXML_NamedNodeMap *)ixmlNamedNodeMap_item(nnMap,index_00);
    }
  }
  return (IXML_Node_conflict *)nnMap_local;
}

Assistant:

IXML_Node *ixmlNamedNodeMap_getNamedItem(
	IXML_NamedNodeMap *nnMap, const DOMString name)
{
	unsigned long index;

	if (nnMap == NULL || name == NULL) {
		return NULL;
	}

	index = ixmlNamedNodeMap_getItemNumber(nnMap, name);
	if (index == (unsigned long)IXML_INVALID_ITEM_NUMBER) {
		return NULL;
	} else {
		return ixmlNamedNodeMap_item(nnMap, index);
	}
}